

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cc
# Opt level: O2

RC __thiscall StatisticsMgr::Reset(StatisticsMgr *this,char *psKey)

{
  int iVar1;
  Boolean BVar2;
  RC RVar3;
  Statistic *this_00;
  int iVar4;
  int which;
  int index;
  
  if (psKey == (char *)0x0) {
    return 0x2329;
  }
  iVar1 = (this->llStats).iLength;
  iVar4 = 0;
  index = 0;
  if (0 < iVar1) {
    iVar4 = iVar1;
    index = 0;
  }
  for (; which = iVar4, iVar4 != index; index = index + 1) {
    this_00 = LinkList<Statistic>::Get(&this->llStats,index);
    BVar2 = Statistic::operator==(this_00,psKey);
    which = index;
    if (BVar2 != '\0') break;
  }
  RVar3 = 0x232a;
  if (which != iVar1) {
    LinkList<Statistic>::Delete(&this->llStats,which);
    RVar3 = 0;
  }
  return RVar3;
}

Assistant:

RC StatisticsMgr::Reset(const char *psKey)
{
   int i, iCount;
   Statistic *pStat = NULL;

   if (psKey==NULL)
      return STAT_INVALID_ARGS;

   iCount = llStats.GetLength();

   for (i=0; i < iCount; i++) {
      pStat = llStats[i];
      if (*pStat == psKey)
         break;
   }

   // If we found the statistic then remove it from the list
   if (i!=iCount)
      llStats.Delete(i);
   else
      return STAT_UNKNOWN_KEY;

   return 0;
}